

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_1::initPrograms
               (SourceCollections *programCollection,Flags flags)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n");
  if ((flags & 1) != 0) {
    std::operator<<((ostream *)&src,"    gl_PointSize = 2.0;\n");
  }
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"vert",&local_1f9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    fragColor = vec4(1.0);\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"frag",&local_1f9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  if ((flags & 6) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar2 = std::operator<<((ostream *)&src,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
    poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_point_size : require\n");
    poVar2 = std::operator<<(poVar2,"layout(vertices = 1) out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[0] = 3.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[1] = 3.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[2] = 3.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelInner[0] = 3.0;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,
                    "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                   );
    if ((flags & 4) != 0) {
      poVar2 = std::operator<<((ostream *)&src,"    // pass as is to eval\n");
      std::operator<<(poVar2,
                      "    gl_out[gl_InvocationID].gl_PointSize = gl_in[gl_InvocationID].gl_PointSize;\n"
                     );
    }
    std::operator<<((ostream *)&src,"}\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"tesc",&local_1f9);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_1d8);
    std::__cxx11::stringbuf::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_1b8,&local_1f8);
    glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b8);
    std::__cxx11::string::~string((string *)(local_1b8 + 8));
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar2 = std::operator<<((ostream *)&src,pcVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
    poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_point_size : require\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles, point_mode) in;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"    // hide all but one vertex\n");
    poVar2 = std::operator<<(poVar2,"    if (gl_TessCoord.x < 0.99)\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4(-2.0, 0.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    else\n");
    std::operator<<(poVar2,"        gl_Position = gl_in[0].gl_Position;\n");
    if ((flags & 4) == 0) {
      if ((flags & 2) != 0) {
        poVar2 = std::operator<<((ostream *)&src,"\n");
        poVar2 = std::operator<<(poVar2,"    // set point size\n");
        pcVar1 = "    gl_PointSize = 4.0;\n";
        goto LAB_0071ad58;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&src,"\n");
      poVar2 = std::operator<<(poVar2,"    // add to point size\n");
      pcVar1 = "    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
LAB_0071ad58:
      std::operator<<(poVar2,pcVar1);
    }
    std::operator<<((ostream *)&src,"}\n");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"tese",&local_1f9);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_1d8);
    std::__cxx11::stringbuf::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_1b8,&local_1f8);
    glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b8);
    std::__cxx11::string::~string((string *)(local_1b8 + 8));
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((flags & 0x18) == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_geometry_shader : require\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_geometry_point_size : require\n");
  poVar2 = std::operator<<(poVar2,"layout(points) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(points, max_vertices = 1) out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"    gl_Position  = gl_in[0].gl_Position;\n");
  if ((flags & 8) == 0) {
    if ((flags & 0x10) == 0) goto LAB_0071aec3;
    pcVar1 = "    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
  }
  else {
    pcVar1 = "    gl_PointSize = 6.0;\n";
  }
  std::operator<<((ostream *)&src,pcVar1);
LAB_0071aec3:
  poVar2 = std::operator<<((ostream *)&src,"\n");
  poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"geom",&local_1f9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const Flags flags)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n";

		if (flags & FLAG_VERTEX_SET)
			src << "    gl_PointSize = 2.0;\n";

		src << "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "layout(location = 0) out mediump vec4 fragColor;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    fragColor = vec4(1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	if (isTessellationStage(flags))
	{
		// Tessellation control shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "#extension GL_EXT_tessellation_point_size : require\n"
				<< "layout(vertices = 1) out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    gl_TessLevelOuter[0] = 3.0;\n"
				<< "    gl_TessLevelOuter[1] = 3.0;\n"
				<< "    gl_TessLevelOuter[2] = 3.0;\n"
				<< "    gl_TessLevelInner[0] = 3.0;\n"
				<< "\n"
				<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n";

			if (flags & FLAG_TESSELLATION_ADD)
				src << "    // pass as is to eval\n"
					<< "    gl_out[gl_InvocationID].gl_PointSize = gl_in[gl_InvocationID].gl_PointSize;\n";

			src << "}\n";

			programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
		}

		// Tessellation evaluation shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "#extension GL_EXT_tessellation_point_size : require\n"
				<< "layout(triangles, point_mode) in;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    // hide all but one vertex\n"
				<< "    if (gl_TessCoord.x < 0.99)\n"
				<< "        gl_Position = vec4(-2.0, 0.0, 0.0, 1.0);\n"
				<< "    else\n"
				<< "        gl_Position = gl_in[0].gl_Position;\n";

			if (flags & FLAG_TESSELLATION_ADD)
				src << "\n"
					<< "    // add to point size\n"
					<< "    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
			else if (flags & FLAG_TESSELLATION_EVALUATION_SET)
				src << "\n"
					<< "    // set point size\n"
					<< "    gl_PointSize = 4.0;\n";

			src << "}\n";

			programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
		}
	}

	if (isGeometryStage(flags))
	{
		// Geometry shader
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "#extension GL_EXT_geometry_point_size : require\n"
			<< "layout(points) in;\n"
			<< "layout(points, max_vertices = 1) out;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position  = gl_in[0].gl_Position;\n";

		if (flags & FLAG_GEOMETRY_SET)
			src << "    gl_PointSize = 6.0;\n";
		else if (flags & FLAG_GEOMETRY_ADD)
			src << "    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";

		src << "\n"
			<< "    EmitVertex();\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}